

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraMan.c
# Opt level: O2

void Fra_ManStop(Fra_Man_t *p)

{
  Aig_Man_t *pAVar1;
  
  if (p->pPars->fVerbose != 0) {
    Fra_ManPrint(p);
  }
  pAVar1 = p->pManAig;
  if (pAVar1 != (Aig_Man_t *)0x0) {
    if (pAVar1->pObjCopies != (Aig_Obj_t **)0x0) {
      free(pAVar1->pObjCopies);
      pAVar1 = p->pManAig;
      pAVar1->pObjCopies = (Aig_Obj_t **)0x0;
    }
    pAVar1->pObjCopies = p->pMemFraig;
    p->pMemFraig = (Aig_Obj_t **)0x0;
  }
  Fra_ManClean(p,0);
  if (p->vTimeouts != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vTimeouts);
  }
  if (p->vPiVars != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vPiVars);
  }
  if (p->pSat != (sat_solver *)0x0) {
    sat_solver_delete(p->pSat);
  }
  if (p->pCla != (Fra_Cla_t *)0x0) {
    Fra_ClassesStop(p->pCla);
  }
  if (p->pSml != (Fra_Sml_t *)0x0) {
    Fra_SmlStop(p->pSml);
  }
  if (p->vCex != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vCex);
  }
  if (p->vOneHots != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vOneHots);
  }
  if (p->pMemFraig != (Aig_Obj_t **)0x0) {
    free(p->pMemFraig);
    p->pMemFraig = (Aig_Obj_t **)0x0;
  }
  if (p->pMemFanins != (Vec_Ptr_t **)0x0) {
    free(p->pMemFanins);
    p->pMemFanins = (Vec_Ptr_t **)0x0;
  }
  if (p->pMemSatNums != (int *)0x0) {
    free(p->pMemSatNums);
    p->pMemSatNums = (int *)0x0;
  }
  free(p->pPatWords);
  free(p);
  return;
}

Assistant:

void Fra_ManStop( Fra_Man_t * p )
{
    if ( p->pPars->fVerbose )
        Fra_ManPrint( p );
    // save mapping from original nodes into FRAIG nodes
    if ( p->pManAig )
    {
        if ( p->pManAig->pObjCopies )
            ABC_FREE( p->pManAig->pObjCopies );
        p->pManAig->pObjCopies = p->pMemFraig;
        p->pMemFraig = NULL;
    }
    Fra_ManClean( p, 0 );
    if ( p->vTimeouts ) Vec_PtrFree( p->vTimeouts );
    if ( p->vPiVars )   Vec_PtrFree( p->vPiVars );
    if ( p->pSat )      sat_solver_delete( p->pSat );
    if ( p->pCla  )     Fra_ClassesStop( p->pCla );
    if ( p->pSml )      Fra_SmlStop( p->pSml );
    if ( p->vCex )      Vec_IntFree( p->vCex );
    if ( p->vOneHots )  Vec_IntFree( p->vOneHots );
    ABC_FREE( p->pMemFraig );
    ABC_FREE( p->pMemFanins );
    ABC_FREE( p->pMemSatNums );
    ABC_FREE( p->pPatWords );
    ABC_FREE( p );
}